

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall t_js_generator::generate_service(t_js_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  t_service *ptVar5;
  undefined4 extraout_var;
  string *psVar6;
  reference pptVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pptVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference pptVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  int __oflag;
  int __oflag_00;
  undefined8 uVar11;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  string local_378;
  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
  local_358;
  t_struct **local_350;
  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
  local_348;
  const_iterator s_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *structs;
  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
  local_318;
  t_struct **local_310;
  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
  local_308;
  const_iterator x_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *exceptions;
  string local_2d8;
  string local_2b8;
  __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_298
  ;
  t_const **local_290;
  __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_288
  ;
  const_iterator c_iter;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_258;
  t_enum **local_250;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_248;
  const_iterator e_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *enums;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8 [32];
  string local_198;
  string local_178;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string f_service_ts_name;
  string local_a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_service_name;
  t_service *tservice_local;
  t_js_generator *this_local;
  
  f_service_name.field_2._8_8_ = tservice;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_58,&local_78,&(this->super_t_oop_generator).super_t_generator.service_name_)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".js");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,pcVar3,(allocator *)(f_service_ts_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_service_,(char *)local_a8,__oflag);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(f_service_ts_name.field_2._M_local_buf + 0xf));
  if ((this->gen_episode_file_ & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&this->f_episode_,
                             (string *)
                             &(this->super_t_oop_generator).super_t_generator.service_name_);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,(string *)&this->thrift_package_output_directory_);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  if ((this->gen_ts_ & 1U) != 0) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_110);
    std::operator+(&local_f0,&local_110,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,".d.ts");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pcVar3,&local_131);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_service_ts_,(char *)local_130,__oflag_00);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string((string *)local_d0);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_158);
  std::operator<<((ostream *)&this->f_service_,local_158);
  std::__cxx11::string::~string(local_158);
  if ((((this->gen_node_ & 1U) != 0) || ((this->gen_es6_ & 1U) != 0)) && ((this->no_ns_ & 1U) != 0))
  {
    poVar4 = std::operator<<((ostream *)&this->f_service_,"\"use strict\";");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  js_includes_abi_cxx11_(&local_178,this);
  poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_178);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_(&local_198,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_198);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if ((this->gen_ts_ & 1U) != 0) {
    ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
    if (ptVar5 != (t_service *)0x0) {
      poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"/// <reference path=\"");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
      poVar4 = std::operator<<(poVar4,".d.ts\" />");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_1b8);
    poVar4 = std::operator<<((ostream *)&this->f_service_ts_,local_1b8);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ts_includes_abi_cxx11_(&local_1d8,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    render_ts_includes_abi_cxx11_(&local_1f8,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string(local_1b8);
    if ((this->gen_node_ & 1U) == 0) {
      poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import { ");
      psVar6 = t_program::get_name_abi_cxx11_
                         ((this->super_t_oop_generator).super_t_generator.program_);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4," } from \"./");
      psVar6 = t_program::get_name_abi_cxx11_
                         ((this->super_t_oop_generator).super_t_generator.program_);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,"_types\";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      psVar6 = t_program::get_name_abi_cxx11_
                         ((this->super_t_oop_generator).super_t_generator.program_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enums,
                     "import ttypes = require(\'./",psVar6);
      std::operator+(&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enums,
                     "_types\');");
      poVar4 = std::operator<<((ostream *)&this->f_service_ts_,(string *)&local_218);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&enums);
      e_iter._M_current =
           (t_enum **)t_program::get_enums((this->super_t_oop_generator).super_t_generator.program_)
      ;
      __gnu_cxx::
      __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
      __normal_iterator(&local_248);
      local_250 = (t_enum **)
                  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin(e_iter._M_current);
      local_248._M_current = local_250;
      while( true ) {
        local_258._M_current =
             (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end(e_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_248,&local_258);
        if (!bVar1) break;
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                  ::operator*(&local_248);
        iVar2 = (*((*pptVar7)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
        poVar4 = std::operator<<(poVar4," = ttypes.");
        js_namespace_abi_cxx11_
                  ((string *)&consts,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar4 = std::operator<<(poVar4,(string *)&consts);
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                  ::operator*(&local_248);
        iVar2 = (*((*pptVar7)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar2));
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&consts);
        __gnu_cxx::
        __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
        operator++(&local_248);
      }
      c_iter._M_current =
           (t_const **)
           t_program::get_consts((this->super_t_oop_generator).super_t_generator.program_);
      __gnu_cxx::
      __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
      __normal_iterator(&local_288);
      local_290 = (t_const **)
                  std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(c_iter._M_current);
      local_288._M_current = local_290;
      while( true ) {
        local_298._M_current =
             (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::end(c_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_288,&local_298);
        if (!bVar1) break;
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                  ::operator*(&local_288);
        t_const::get_name_abi_cxx11_(&local_2b8,*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)&local_2b8);
        poVar4 = std::operator<<(poVar4," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_2d8,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar4 = std::operator<<(poVar4,(string *)&local_2d8);
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                  ::operator*(&local_288);
        t_const::get_name_abi_cxx11_((string *)&exceptions,*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)&exceptions);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&exceptions);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b8);
        __gnu_cxx::
        __normal_iterator<t_const_*const_*,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
        operator++(&local_288);
      }
      x_iter._M_current =
           (t_struct **)
           t_program::get_xceptions((this->super_t_oop_generator).super_t_generator.program_);
      __gnu_cxx::
      __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      __normal_iterator(&local_308);
      local_310 = (t_struct **)
                  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin(x_iter._M_current);
      local_308._M_current = local_310;
      while( true ) {
        local_318._M_current =
             (t_struct **)
             std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end(x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_308,&local_318);
        if (!bVar1) break;
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                  ::operator*(&local_308);
        iVar2 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_02,iVar2));
        poVar4 = std::operator<<(poVar4," = ttypes.");
        js_namespace_abi_cxx11_
                  ((string *)&structs,this,(this->super_t_oop_generator).super_t_generator.program_)
        ;
        poVar4 = std::operator<<(poVar4,(string *)&structs);
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                  ::operator*(&local_308);
        iVar2 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_03,iVar2));
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&structs);
        __gnu_cxx::
        __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
        ::operator++(&local_308);
      }
      s_iter._M_current =
           (t_struct **)
           t_program::get_structs((this->super_t_oop_generator).super_t_generator.program_);
      __gnu_cxx::
      __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
      __normal_iterator(&local_348);
      local_350 = (t_struct **)
                  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin(s_iter._M_current);
      local_348._M_current = local_350;
      while( true ) {
        local_358._M_current =
             (t_struct **)
             std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end(s_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_348,&local_358);
        if (!bVar1) break;
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                  ::operator*(&local_348);
        iVar2 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_04,iVar2));
        poVar4 = std::operator<<(poVar4," = ttypes.");
        js_namespace_abi_cxx11_
                  (&local_378,this,(this->super_t_oop_generator).super_t_generator.program_);
        poVar4 = std::operator<<(poVar4,(string *)&local_378);
        pptVar9 = __gnu_cxx::
                  __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                  ::operator*(&local_348);
        iVar2 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_05,iVar2));
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_378);
        __gnu_cxx::
        __normal_iterator<t_struct_*const_*,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
        ::operator++(&local_348);
      }
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      if ((this->gen_node_ & 1U) == 0) {
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"declare module \"./");
        psVar6 = t_program::get_name_abi_cxx11_
                           ((this->super_t_oop_generator).super_t_generator.program_);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"_types\" {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        ts_indent_abi_cxx11_(&local_398,this);
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,(string *)&local_398);
        poVar4 = std::operator<<(poVar4,"module ");
        psVar6 = t_program::get_name_abi_cxx11_
                           ((this->super_t_oop_generator).super_t_generator.program_);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4," {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_398);
        t_generator::indent_up((t_generator *)this);
      }
      else {
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"declare module ");
        poVar4 = std::operator<<(poVar4,(string *)&this->ts_module_);
        std::operator<<(poVar4," {");
      }
    }
  }
  if ((this->gen_node_ & 1U) != 0) {
    ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
    if (ptVar5 != (t_service *)0x0) {
      poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&this->js_const_type_);
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_06,iVar2));
      poVar4 = std::operator<<(poVar4," = require(\'./");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_07,iVar2));
      poVar4 = std::operator<<(poVar4,"\');");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&this->js_const_type_);
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_08,iVar2));
      poVar4 = std::operator<<(poVar4,"Client = ");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_09,iVar2));
      poVar4 = std::operator<<(poVar4,".Client;");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&this->js_const_type_);
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_10,iVar2));
      poVar4 = std::operator<<(poVar4,"Processor = ");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_11,iVar2));
      poVar4 = std::operator<<(poVar4,".Processor;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"import ");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_12,iVar2));
      poVar4 = std::operator<<(poVar4," = require(\'./");
      ptVar5 = t_service::get_extends((t_service *)f_service_name.field_2._8_8_);
      iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_13,iVar2));
      poVar4 = std::operator<<(poVar4,"\');");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&this->js_const_type_);
    psVar6 = t_program::get_name_abi_cxx11_
                       ((this->super_t_oop_generator).super_t_generator.program_);
    std::operator+(&local_3d8,"ttypes = require(\'./",psVar6);
    std::operator+(&local_3b8,&local_3d8,"_types\');");
    poVar4 = std::operator<<(poVar4,(string *)&local_3b8);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  generate_service_helpers(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_interface(this,(t_service *)f_service_name.field_2._8_8_);
  uVar11 = f_service_name.field_2._8_8_;
  generate_service_client(this,(t_service *)f_service_name.field_2._8_8_);
  iVar2 = (int)uVar11;
  if ((this->gen_node_ & 1U) != 0) {
    uVar11 = f_service_name.field_2._8_8_;
    generate_service_processor(this,(t_service *)f_service_name.field_2._8_8_);
    iVar2 = (int)uVar11;
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_service_,iVar2);
  if ((this->gen_ts_ & 1U) != 0) {
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      if ((this->gen_node_ & 1U) == 0) {
        t_generator::indent_down((t_generator *)this);
        ts_indent_abi_cxx11_(&local_3f8,this);
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,(string *)&local_3f8);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3f8);
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"}");
        iVar2 = 0x56be38;
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = std::operator<<((ostream *)&this->f_service_ts_,"}");
        iVar2 = 0x56be38;
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_ts_,iVar2);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_js_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + service_name_ + ".js";
  f_service_.open(f_service_name.c_str());
  if (gen_episode_file_) {
    f_episode_ << service_name_ << ":" << thrift_package_output_directory_ << "/" << service_name_ << endl;
  }

  if (gen_ts_) {
    string f_service_ts_name = get_out_dir() + service_name_ + ".d.ts";
    f_service_ts_.open(f_service_ts_name.c_str());
  }

  f_service_ << autogen_comment();

  if ((gen_node_ || gen_es6_) && no_ns_) {
    f_service_ << "\"use strict\";" << endl << endl;
  }

  f_service_ << js_includes() << endl << render_includes() << endl;

  if (gen_ts_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ts_ << "/// <reference path=\"" << tservice->get_extends()->get_name()
                    << ".d.ts\" />" << endl;
    }
    f_service_ts_ << autogen_comment() << endl << ts_includes() << endl << render_ts_includes() << endl;
    if (gen_node_) {
      f_service_ts_ << "import ttypes = require('./" + program_->get_name() + "_types');" << endl;
      // Generate type aliases
      // enum
      vector<t_enum*> const& enums = program_->get_enums();
      vector<t_enum*>::const_iterator e_iter;
      for (e_iter = enums.begin(); e_iter != enums.end(); ++e_iter) {
        f_service_ts_ << "import " << (*e_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*e_iter)->get_name() << endl;
      }
      // const
      vector<t_const*> const& consts = program_->get_consts();
      vector<t_const*>::const_iterator c_iter;
      for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
        f_service_ts_ << "import " << (*c_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*c_iter)->get_name() << endl;
      }
      // exception
      vector<t_struct*> const& exceptions = program_->get_xceptions();
      vector<t_struct*>::const_iterator x_iter;
      for (x_iter = exceptions.begin(); x_iter != exceptions.end(); ++x_iter) {
        f_service_ts_ << "import " << (*x_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*x_iter)->get_name() << endl;
      }
      // structs
      vector<t_struct*> const& structs = program_->get_structs();
      vector<t_struct*>::const_iterator s_iter;
      for (s_iter = structs.begin(); s_iter != structs.end(); ++s_iter) {
        f_service_ts_ << "import " << (*s_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*s_iter)->get_name() << endl;
      }
    } else {
      f_service_ts_ << "import { " << program_->get_name() << " } from \"./" << program_->get_name() << "_types\";" << endl << endl;
    }
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "declare module " << ts_module_ << " {";
      } else {
        f_service_ts_ << "declare module \"./" << program_->get_name() << "_types\" {" << endl;
        indent_up();
        f_service_ts_ << ts_indent() << "module " << program_->get_name() << " {" << endl;
        indent_up();
      }
    }
  }

  if (gen_node_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ << js_const_type_ <<  tservice->get_extends()->get_name() << " = require('./"
                 << tservice->get_extends()->get_name() << "');" << endl << js_const_type_
                 << tservice->get_extends()->get_name()
                 << "Client = " << tservice->get_extends()->get_name() << ".Client;" << endl
                 << js_const_type_ << tservice->get_extends()->get_name()
                 << "Processor = " << tservice->get_extends()->get_name() << ".Processor;" << endl;

      f_service_ts_ << "import " << tservice->get_extends()->get_name() << " = require('./"
                    << tservice->get_extends()->get_name() << "');" << endl;
    }

    f_service_ << js_const_type_ << "ttypes = require('./" + program_->get_name() + "_types');" << endl;
  }

  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);

  if (gen_node_) {
    generate_service_processor(tservice);
  }

  f_service_.close();
  if (gen_ts_) {
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "}" << endl;
      } else {
        indent_down();
        f_service_ts_ << ts_indent() << "}" << endl;
        f_service_ts_ << "}" << endl;
      }
    }
    f_service_ts_.close();
  }
}